

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O0

uchar * rans_compress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  RansEncSymbol *s0;
  RansEncSymbol *s1;
  RansEncSymbol *s2;
  RansEncSymbol *s3;
  uint64_t tr;
  int M;
  int m;
  int fsum;
  int x;
  int rle;
  int tab_size;
  int j;
  int i;
  int F [256];
  uchar *local_1060;
  uint8_t *ptr;
  RansState rans3;
  RansState rans2;
  RansState rans1;
  RansState rans0;
  RansEncSymbol syms [256];
  uchar *out_end;
  uchar *cp;
  uchar *out_buf;
  uint *out_size_local;
  uint in_size_local;
  uchar *in_local;
  
  dVar10 = (double)in_size * 1.05 + 198147.0 + 9.0;
  uVar8 = (ulong)dVar10;
  in_local = (uchar *)malloc(uVar8 | (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f);
  memset(&j,0,0x400);
  M = 0;
  if (in_local == (uchar *)0x0) {
    in_local = (uchar *)0x0;
  }
  else {
    puVar6 = in_local + (long)(int)((double)in_size * 1.05) + 0x3060c;
    local_1060 = puVar6;
    for (tab_size = 0; (uint)tab_size < in_size; tab_size = tab_size + 1) {
      (&j)[in[tab_size]] = (&j)[in[tab_size]] + 1;
    }
    tr._0_4_ = 0;
    tr._4_4_ = 0;
    for (rle = 0; rle < 0x100; rle = rle + 1) {
      if ((&j)[rle] != 0) {
        if (tr._4_4_ < (&j)[rle]) {
          tr._4_4_ = (&j)[rle];
          tr._0_4_ = rle;
        }
        iVar4 = (int)((long)(&j)[rle] *
                      (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000000)) / ZEXT416(in_size),0) +
                      0x40000000 / (ulong)in_size) >> 0x1f);
        (&j)[rle] = iVar4;
        if (iVar4 == 0) {
          (&j)[rle] = 1;
        }
        M = (&j)[rle] + M;
      }
    }
    if (M + 1 < 0x1000) {
      (&j)[(int)tr] = (0x1000 - (M + 1)) + (&j)[(int)tr];
    }
    else {
      (&j)[(int)tr] = (&j)[(int)tr] - (M + -0xfff);
    }
    if ((&j)[(int)tr] < 1) {
      __assert_fail("F[M]>0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                    ,0x6d,
                    "unsigned char *rans_compress_O0(unsigned char *, unsigned int, unsigned int *)"
                   );
    }
    out_end = in_local + 9;
    fsum = 0;
    m = 0;
    for (rle = 0; puVar7 = out_end, rle < 0x100; rle = rle + 1) {
      if ((&j)[rle] != 0) {
        if (fsum == 0) {
          puVar7 = out_end + 1;
          *out_end = (uchar)rle;
          if ((rle != 0) && (iVar4 = rle, (&j)[rle + -1] != 0)) {
            do {
              fsum = iVar4 + 1;
              bVar9 = false;
              if (fsum < 0x100) {
                bVar9 = (&j)[fsum] != 0;
              }
              iVar4 = fsum;
            } while (bVar9);
            fsum = fsum - (rle + 1);
            *puVar7 = (uchar)fsum;
            puVar7 = out_end + 2;
          }
        }
        else {
          fsum = fsum + -1;
        }
        out_end = puVar7;
        if ((&j)[rle] < 0x80) {
          *out_end = (uchar)(&j)[rle];
          out_end = out_end + 1;
        }
        else {
          puVar7 = out_end + 1;
          *out_end = (byte)((uint)(&j)[rle] >> 8) | 0x80;
          out_end = out_end + 2;
          *puVar7 = (uchar)(&j)[rle];
        }
        RansEncSymbolInit((RansEncSymbol *)(&rans1 + (long)rle * 4),m,(&j)[rle],0xc);
        m = (&j)[rle] + m;
      }
    }
    out_end._0_4_ = (int)out_end + 1;
    *puVar7 = '\0';
    cp._0_4_ = (int)in_local;
    RansEncInit(&rans2);
    RansEncInit(&rans3);
    RansEncInit((RansState *)((long)&ptr + 4));
    RansEncInit((RansState *)&ptr);
    uVar5 = in_size & 3;
    switch(uVar5) {
    case 3:
      RansEncPutSymbol((RansState *)((long)&ptr + 4),&local_1060,
                       (RansEncSymbol *)(&rans1 + (ulong)in[in_size - (uVar5 - 2)] * 4));
    case 2:
      RansEncPutSymbol(&rans3,&local_1060,
                       (RansEncSymbol *)(&rans1 + (ulong)in[in_size - (uVar5 - 1)] * 4));
    case 1:
      RansEncPutSymbol(&rans2,&local_1060,(RansEncSymbol *)(&rans1 + (ulong)in[in_size - uVar5] * 4)
                      );
    case 0:
    default:
      for (tab_size = in_size & 0xfffffffc; 0 < tab_size; tab_size = tab_size + -4) {
        bVar1 = in[tab_size + -2];
        bVar2 = in[tab_size + -3];
        bVar3 = in[tab_size + -4];
        RansEncPutSymbol((RansState *)&ptr,&local_1060,
                         (RansEncSymbol *)(&rans1 + (ulong)in[tab_size + -1] * 4));
        RansEncPutSymbol((RansState *)((long)&ptr + 4),&local_1060,
                         (RansEncSymbol *)(&rans1 + (ulong)bVar1 * 4));
        RansEncPutSymbol(&rans3,&local_1060,(RansEncSymbol *)(&rans1 + (ulong)bVar2 * 4));
        RansEncPutSymbol(&rans2,&local_1060,(RansEncSymbol *)(&rans1 + (ulong)bVar3 * 4));
      }
      RansEncFlush((RansState *)&ptr,&local_1060);
      RansEncFlush((RansState *)((long)&ptr + 4),&local_1060);
      RansEncFlush(&rans3,&local_1060);
      RansEncFlush(&rans2,&local_1060);
      *out_size = ((int)puVar6 - (int)local_1060) + ((int)out_end - (int)cp);
      *in_local = '\0';
      in_local[1] = (char)*out_size + 0xf7;
      in_local[2] = (uchar)(*out_size - 9 >> 8);
      in_local[3] = (uchar)(*out_size - 9 >> 0x10);
      in_local[4] = (uchar)(*out_size - 9 >> 0x18);
      in_local[5] = (uchar)in_size;
      in_local[6] = (uchar)(in_size >> 8);
      in_local[7] = (uchar)(in_size >> 0x10);
      in_local[8] = (uchar)(in_size >> 0x18);
      memmove(in_local + ((int)out_end - (int)cp),local_1060,(long)puVar6 - (long)local_1060);
    }
  }
  return in_local;
}

Assistant:

unsigned char *rans_compress_O0(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    unsigned char *cp, *out_end;
    RansEncSymbol syms[256];
    RansState rans0, rans1, rans2, rans3;
    uint8_t* ptr;
    int F[256] = {0}, i, j, tab_size, rle, x, fsum = 0;
    int m = 0, M = 0;
    uint64_t tr;

    if (!out_buf)
	return NULL;

    ptr = out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;

    // Compute statistics
    for (i = 0; i < in_size; i++) {
	F[in[i]]++;
    }
    tr = ((uint64_t)TOTFREQ<<31)/in_size + (1<<30)/in_size;

    // Normalise so T[i] == TOTFREQ
    for (m = M = j = 0; j < 256; j++) {
	if (!F[j])
	    continue;

	if (m < F[j])
	    m = F[j], M = j;

	if ((F[j] = (F[j]*tr)>>31) == 0)
	    F[j] = 1;
	fsum += F[j];
    }

    fsum++;
    if (fsum < TOTFREQ)
	F[M] += TOTFREQ-fsum;
    else
	F[M] -= fsum-TOTFREQ;

    //printf("F[%d]=%d\n", M, F[M]);
    assert(F[M]>0);

    // Encode statistics.
    cp = out_buf+9;

    for (x = rle = j = 0; j < 256; j++) {
	if (F[j]) {
	    // j
	    if (rle) {
		rle--;
	    } else {
		*cp++ = j;
		if (!rle && j && F[j-1])  {
		    for(rle=j+1; rle<256 && F[rle]; rle++)
			;
		    rle -= j+1;
		    *cp++ = rle;
		}
		//fprintf(stderr, "%d: %d %d\n", j, rle, N[j]);
	    }

	    // F[j]
	    if (F[j]<128) {
		*cp++ = F[j];
	    } else {
		*cp++ = 128 | (F[j]>>8);
		*cp++ = F[j]&0xff;
	    }
	    RansEncSymbolInit(&syms[j], x, F[j], TF_SHIFT);
	    x += F[j];
	}
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp-out_buf;

    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    switch (i=(in_size&3)) {
    case 3: RansEncPutSymbol(&rans2, &ptr, &syms[in[in_size-(i-2)]]);
    case 2: RansEncPutSymbol(&rans1, &ptr, &syms[in[in_size-(i-1)]]);
    case 1: RansEncPutSymbol(&rans0, &ptr, &syms[in[in_size-(i-0)]]);
    case 0:
	break;
    }
    for (i=(in_size &~3); i>0; i-=4) {
	RansEncSymbol *s3 = &syms[in[i-1]];
	RansEncSymbol *s2 = &syms[in[i-2]];
	RansEncSymbol *s1 = &syms[in[i-3]];
	RansEncSymbol *s0 = &syms[in[i-4]];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);
    }

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    // Finalise block size and return it
    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;

    *cp++ = 0; // order
    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}